

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O3

void RigidBodyDynamics::NonlinearEffects(Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  pointer pSVar14;
  pointer pSVar15;
  pointer pJVar16;
  pointer pMVar17;
  double *pdVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  uint uVar39;
  ActualDstType actualDst;
  pointer puVar40;
  ulong uVar41;
  ulong uVar42;
  pointer pBVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  bool bVar49;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  SpatialVector local_98;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       -(model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        .m_storage.m_data.array[2];
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       -(model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        .m_storage.m_data.array[0];
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       -(model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        .m_storage.m_data.array[1];
  pSVar14 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(double *)
   ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = 0.0;
  *(double *)
   ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
  *(double *)
   ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = 0.0;
  *(undefined8 *)
   &(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  pSVar14 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(undefined8 *)
   &(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  *(double *)
   ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  *(double *)
   ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  *(double *)
   ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  puVar40 = (model->mJointUpdateOrder).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (4 < (ulong)((long)(model->mJointUpdateOrder).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar40)) {
    uVar41 = 1;
    uVar48 = 2;
    do {
      jcalc(model,puVar40[uVar41],Q,QDot);
      puVar40 = (model->mJointUpdateOrder).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar49 = uVar48 < (ulong)((long)(model->mJointUpdateOrder).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar40 >>
                               2);
      uVar41 = uVar48;
      uVar48 = (ulong)((int)uVar48 + 1);
    } while (bVar49);
  }
  uVar41 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (1 < uVar41) {
    uVar48 = 1;
    uVar42 = 2;
    do {
      uVar41 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar48];
      if (uVar41 == 0) {
        pSVar14 = (model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar15 = (model->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar29 = *(double *)
                  ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(undefined8 *)
         &pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             *(undefined8 *)
              &pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        *(double *)
         ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = dVar29;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar29 = pdVar1[1];
        pdVar2 = (double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar29;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar29 = pdVar1[1];
        pdVar2 = (double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar29;
        Math::SpatialTransform::apply
                  ((model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar48,&local_98);
        pSVar14 = (model->a).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar1 = local_b8;
        pdVar1[1] = dStack_b0;
        pdVar1 = (double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar1 = local_c8;
        pdVar1[1] = dStack_c0;
        *(double *)
         &pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = local_d8;
        *(double *)
         ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = dStack_d0;
      }
      else {
        Math::SpatialTransform::apply
                  ((model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar48,
                   (model->v).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar41);
        pSVar14 = (model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar15 = (model->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar29 = dStack_d0 +
                 *(double *)
                  ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        auVar19._8_4_ = SUB84(dVar29,0);
        auVar19._0_8_ =
             local_d8 +
             *(double *)
              &pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        auVar19._12_4_ = (int)((ulong)dVar29 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar19;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar29 = dStack_c0 + pdVar1[1];
        auVar20._8_4_ = SUB84(dVar29,0);
        auVar20._0_8_ = local_c8 + *pdVar1;
        auVar20._12_4_ = (int)((ulong)dVar29 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar20;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar29 = dStack_b0 + pdVar1[1];
        auVar21._8_4_ = SUB84(dVar29,0);
        auVar21._0_8_ = local_b8 + *pdVar1;
        auVar21._12_4_ = (int)((ulong)dVar29 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar21;
        pSVar14 = (model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar15 = (model->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar29 = *(double *)
                  ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar6 = *(double *)
                 &pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        dVar7 = *(double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        dVar8 = *(double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
        dVar9 = *(double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        dVar30 = *pdVar1;
        dVar31 = pdVar1[1];
        dVar10 = *(double *)
                  &pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        dVar11 = *(double *)
                  ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar32 = *pdVar1;
        dVar33 = pdVar1[1];
        dVar12 = *(double *)
                  ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
        pSVar14 = (model->c_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar15 = (model->c).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar13 = *(double *)
                  ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)
         &pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             dVar30 * -dVar29 + dVar7 * dVar31 +
             *(double *)
              &pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        *(double *)
         ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             dVar10 * dVar29 + -dVar6 * dVar31 + dVar13;
        pdVar1 = (double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar13 = pdVar1[1];
        pdVar2 = (double *)
                 ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar2 = dVar10 * -dVar7 + dVar30 * dVar6 + *pdVar1;
        pdVar2[1] = dVar33 * dVar7 + ((dVar31 * dVar9 - dVar8 * dVar30) - dVar29 * dVar32) + dVar13;
        pdVar1 = (double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar7 = dVar6 * dVar32 + dVar12 * -dVar7 + dVar10 * -dVar9 + dVar11 * dVar30 + pdVar1[1];
        auVar22._8_4_ = SUB84(dVar7,0);
        auVar22._0_8_ =
             -dVar6 * dVar33 + dVar12 * dVar29 + dVar10 * dVar8 + -dVar11 * dVar31 + *pdVar1;
        auVar22._12_4_ = (int)((ulong)dVar7 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar22;
        Math::SpatialTransform::apply
                  ((model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar48,
                   (model->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar48]);
        pSVar14 = (model->a).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar15 = (model->c).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar29 = dStack_d0 +
                 *(double *)
                  ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        auVar23._8_4_ = SUB84(dVar29,0);
        auVar23._0_8_ =
             local_d8 +
             *(double *)
              &pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        auVar23._12_4_ = (int)((ulong)dVar29 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar23;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar29 = dStack_c0 + pdVar1[1];
        auVar24._8_4_ = SUB84(dVar29,0);
        auVar24._0_8_ = local_c8 + *pdVar1;
        auVar24._12_4_ = (int)((ulong)dVar29 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar24;
        pdVar1 = (double *)
                 ((long)&pSVar15[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar29 = dStack_b0 + pdVar1[1];
        auVar25._8_4_ = SUB84(dVar29,0);
        auVar25._0_8_ = local_b8 + *pdVar1;
        auVar25._12_4_ = (int)((ulong)dVar29 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar25;
      }
      pBVar43 = (model->mBodies).
                super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                .
                super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pBVar43[uVar48].mIsVirtual == false) {
        Math::SpatialRigidBodyInertia::operator*
                  ((model->I).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar48,
                   (model->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar48);
        pSVar14 = (model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialRigidBodyInertia::operator*
                  ((model->I).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar48,pSVar14 + uVar48);
        dVar29 = *(double *)
                  ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar6 = *(double *)
                 &pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        dVar7 = *(double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        dVar8 = *(double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
        dVar9 = *(double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar10 = *(double *)
                  ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
        pSVar14 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        *(double *)
         &pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             dVar9 * dStack_40 + local_48 * -dVar8 + -dVar29 * dStack_60 + dVar7 * local_58 +
             local_d8;
        *(double *)
         ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             -dVar10 * dStack_40 + dStack_50 * dVar8 + dVar29 * local_68 + -dVar6 * local_58 +
             dStack_d0;
        pdVar1 = (double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar1 = local_48 * dVar10 + ((dStack_60 * dVar6 - dVar7 * local_68) - dVar9 * dStack_50) +
                  local_c8;
        pdVar1[1] = local_48 * -dVar29 + dStack_40 * dVar7 + dStack_c0;
        pdVar1 = (double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar1 = dStack_50 * dVar29 + -dVar6 * dStack_40 + local_b8;
        pdVar1[1] = dStack_50 * -dVar7 + dVar6 * local_48 + dStack_b0;
        pBVar43 = (model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        pSVar14 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar1 = 0.0;
        pdVar1[1] = 0.0;
        pdVar1 = (double *)
                 ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar1 = 0.0;
        pdVar1[1] = 0.0;
        *(undefined8 *)
         &pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
        *(double *)
         ((long)&pSVar14[uVar48].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      }
      uVar41 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar43 >> 4) *
               0x6db6db6db6db6db7;
      bVar49 = uVar42 <= uVar41;
      lVar47 = uVar41 - uVar42;
      uVar48 = uVar42;
      uVar42 = (ulong)((int)uVar42 + 1);
    } while (bVar49 && lVar47 != 0);
  }
  uVar39 = (int)uVar41 - 1;
  if (uVar39 != 0) {
    uVar41 = (ulong)uVar39;
    lVar44 = uVar41 * 0x18;
    lVar47 = uVar41 * 0x24 + 0x20;
    lVar45 = uVar41 * 0x60;
    lVar46 = uVar41 * 0x30;
    do {
      uVar48 = uVar41 - 1;
      pJVar16 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar14 = (model->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&pJVar16->mDoFCount + lVar44) == 3) {
        pMVar17 = (model->multdof3_S).
                  super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  .
                  super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar42 = (ulong)*(uint *)((long)&pJVar16->q_index + lVar44);
        pdVar18 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        pdVar1 = (double *)
                 ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar44 * 2);
        dVar29 = *pdVar1;
        dVar6 = pdVar1[1];
        pdVar1 = (double *)
                 ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                 lVar44 * 2 + 0x10);
        dVar7 = *pdVar1;
        dVar8 = pdVar1[1];
        pdVar1 = (double *)
                 ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                 lVar44 * 2 + 0x20);
        dVar9 = *pdVar1;
        dVar10 = pdVar1[1];
        pdVar2 = (double *)
                 ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + lVar47 * 4 + -0x80);
        pdVar3 = (double *)
                 ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + lVar47 * 4 + -0x70);
        pdVar4 = (double *)
                 ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + lVar47 * 4 + -0x60);
        pdVar1 = (double *)
                 ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + lVar47 * 4 + -0x50);
        dVar11 = *pdVar1;
        dVar12 = pdVar1[1];
        pdVar1 = (double *)
                 ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + lVar47 * 4 + -0x40);
        dVar13 = *pdVar1;
        dVar30 = pdVar1[1];
        pdVar1 = (double *)
                 ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + lVar47 * 4 + -0x30);
        dVar31 = *pdVar1;
        dVar32 = pdVar1[1];
        pdVar1 = (double *)
                 ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + lVar47 * 4 + -0x20);
        dVar33 = *pdVar1;
        dVar34 = pdVar1[1];
        pdVar1 = (double *)
                 ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + lVar47 * 4 + -0x10);
        dVar35 = *pdVar1;
        dVar36 = pdVar1[1];
        pdVar1 = (double *)
                 ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + lVar47 * 4);
        dVar37 = *pdVar1;
        dVar38 = pdVar1[1];
        pdVar1 = pdVar18 + uVar42;
        *pdVar1 = pdVar4[1] * dVar10 + pdVar3[1] * dVar8 + pdVar2[1] * dVar6 +
                  *pdVar4 * dVar9 + *pdVar3 * dVar7 + *pdVar2 * dVar29;
        pdVar1[1] = dVar32 * dVar10 + dVar30 * dVar8 + dVar12 * dVar6 +
                    dVar31 * dVar9 + dVar13 * dVar7 + dVar11 * dVar29;
        pdVar18[uVar42 + 2] =
             dVar10 * dVar38 + dVar8 * dVar36 + dVar6 * dVar34 +
             dVar9 * dVar37 + dVar7 * dVar35 + dVar29 * dVar33;
      }
      else {
        pSVar15 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)
                 ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar44 * 2);
        pdVar3 = (double *)
                 ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                 lVar44 * 2 + 0x10);
        pdVar4 = (double *)
                 ((long)&(pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                 lVar44 * 2 + 0x20);
        pdVar2 = (double *)
                 ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar44 * 2);
        pdVar18 = (double *)
                  ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                  lVar44 * 2 + 0x10);
        pdVar5 = (double *)
                 ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                 lVar44 * 2 + 0x20);
        (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [*(uint *)((long)&pJVar16->q_index + lVar44)] =
             pdVar4[1] * pdVar5[1] + pdVar3[1] * pdVar18[1] + pdVar1[1] * pdVar2[1] +
             *pdVar4 * *pdVar5 + *pdVar3 * *pdVar18 + *pdVar1 * *pdVar2;
      }
      uVar42 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar41];
      if (uVar42 != 0) {
        pSVar14 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(((model->X_lambda).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar45)
                   ,(SpatialVector *)
                    ((long)&(pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar46));
        uVar39 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar41];
        pSVar15 = (model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar29 = *(double *)
                  ((long)&pSVar14[uVar42].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                 dStack_d0;
        auVar26._8_4_ = SUB84(dVar29,0);
        auVar26._0_8_ =
             *(double *)
              &pSVar14[uVar42].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + local_d8;
        auVar26._12_4_ = (int)((ulong)dVar29 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar15[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar26;
        pdVar1 = (double *)
                 ((long)&pSVar14[uVar42].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar29 = pdVar1[1] + dStack_c0;
        auVar27._8_4_ = SUB84(dVar29,0);
        auVar27._0_8_ = *pdVar1 + local_c8;
        auVar27._12_4_ = (int)((ulong)dVar29 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar15[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar27;
        pdVar1 = (double *)
                 ((long)&pSVar14[uVar42].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar29 = pdVar1[1] + dStack_b0;
        auVar28._8_4_ = SUB84(dVar29,0);
        auVar28._0_8_ = *pdVar1 + local_b8;
        auVar28._12_4_ = (int)((ulong)dVar29 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar15[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar28;
      }
      lVar44 = lVar44 + -0x18;
      lVar47 = lVar47 + -0x24;
      lVar45 = lVar45 + -0x60;
      lVar46 = lVar46 + -0x30;
      uVar41 = uVar48;
    } while ((int)uVar48 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void NonlinearEffects (
		Model &model,
		const VectorNd &Q,
		const VectorNd &QDot,
		VectorNd &Tau
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;

	SpatialVector spatial_gravity (0., 0., 0., -model.gravity[0], -model.gravity[1], -model.gravity[2]);

	// Reset the velocity of the root body
	model.v[0].setZero();
	model.a[0] = spatial_gravity;

	for (unsigned int i = 1; i < model.mJointUpdateOrder.size(); i++) {
		jcalc (model, model.mJointUpdateOrder[i], Q, QDot);
	}

	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		if (model.lambda[i] == 0) {
			model.v[i] = model.v_J[i];
			model.a[i] = model.X_lambda[i].apply(spatial_gravity);
		}	else {
			model.v[i] = model.X_lambda[i].apply(model.v[model.lambda[i]]) + model.v_J[i];
			model.c[i] = model.c_J[i] + crossm(model.v[i],model.v_J[i]);
			model.a[i] = model.X_lambda[i].apply(model.a[model.lambda[i]]) + model.c[i];
		}

		if (!model.mBodies[i].mIsVirtual) {
			model.f[i] = model.I[i] * model.a[i] + crossf(model.v[i],model.I[i] * model.v[i]);
		} else {
			model.f[i].setZero();
		}
	}

	for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
		if (model.mJoints[i].mDoFCount == 3) {
			Tau.block<3,1>(model.mJoints[i].q_index, 0) = model.multdof3_S[i].transpose() * model.f[i];
		} else {
			Tau[model.mJoints[i].q_index] = model.S[i].dot(model.f[i]);
		}

		if (model.lambda[i] != 0) {
			model.f[model.lambda[i]] = model.f[model.lambda[i]] + model.X_lambda[i].applyTranspose(model.f[i]);
		}
	}
}